

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::ClipperOffset::DoRound(ClipperOffset *this,int j,int k,MathKernel *math)

{
  pointer pDVar1;
  pointer pIVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  IntPoint local_48;
  double local_38;
  double dStack_30;
  
  pDVar1 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar7 = std::function<double_(double,_double)>::operator()
                    (&math->atan2,this->m_sinA,pDVar1[k].X * pDVar1[j].X + pDVar1[k].Y * pDVar1[j].Y
                    );
  dVar7 = ABS(dVar7) * this->m_StepsPerRad;
  uVar3 = (ulong)(dVar7 + *(double *)(&DAT_0011b070 + (ulong)(dVar7 < 0.0) * 8));
  uVar5 = 1;
  if (1 < (int)uVar3) {
    uVar5 = uVar3;
  }
  uVar5 = uVar5 & 0xffffffff;
  pDVar1 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start + k;
  dVar7 = pDVar1->X;
  dVar10 = pDVar1->Y;
  while (iVar4 = (int)uVar5, uVar5 = (ulong)(iVar4 - 1), iVar4 != 0) {
    pIVar2 = (this->m_srcPoly).
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start;
    dVar8 = this->m_delta * dVar7 + (double)pIVar2[j].X;
    dVar9 = this->m_delta * dVar10 + (double)pIVar2[j].Y;
    uVar3 = -(ulong)(dVar8 < 0.0);
    uVar6 = -(ulong)(dVar9 < 0.0);
    local_48.X = (cInt)((double)(uVar3 & 0xbfe0000000000000 | ~uVar3 & 0x3fe0000000000000) + dVar8);
    local_48.Y = (cInt)((double)(uVar6 & 0xbfe0000000000000 | ~uVar6 & 0x3fe0000000000000) + dVar9);
    local_38 = dVar7;
    dStack_30 = dVar10;
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
    emplace_back<ClipperLib::IntPoint>(&this->m_destPoly,&local_48);
    dVar7 = local_38 * this->m_cos + -this->m_sin * dStack_30;
    dVar10 = local_38 * this->m_sin + this->m_cos * dStack_30;
  }
  pIVar2 = (this->m_srcPoly).
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = (this->m_normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start + j;
  dVar7 = this->m_delta * pDVar1->X + (double)pIVar2[j].X;
  dVar10 = this->m_delta * pDVar1->Y + (double)pIVar2[j].Y;
  uVar5 = -(ulong)(dVar7 < 0.0);
  uVar3 = -(ulong)(dVar10 < 0.0);
  local_48.X = (cInt)((double)(uVar5 & 0xbfe0000000000000 | ~uVar5 & 0x3fe0000000000000) + dVar7);
  local_48.Y = (cInt)((double)(uVar3 & 0xbfe0000000000000 | ~uVar3 & 0x3fe0000000000000) + dVar10);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
  emplace_back<ClipperLib::IntPoint>(&this->m_destPoly,&local_48);
  return;
}

Assistant:

void ClipperOffset::DoRound(int j, int k, const MathKernel& math)
{
  double a = math.atan2(m_sinA,
  m_normals[k].X * m_normals[j].X + m_normals[k].Y * m_normals[j].Y);
  int steps = std::max((int)Round(m_StepsPerRad * std::fabs(a)), 1);

  double X = m_normals[k].X, Y = m_normals[k].Y, X2;
  for (int i = 0; i < steps; ++i)
  {
    m_destPoly.push_back(IntPoint(
        Round(m_srcPoly[j].X + X * m_delta),
        Round(m_srcPoly[j].Y + Y * m_delta)));
    X2 = X;
    X = X * m_cos - m_sin * Y;
    Y = X2 * m_sin + Y * m_cos;
  }
  m_destPoly.push_back(IntPoint(
  Round(m_srcPoly[j].X + m_normals[j].X * m_delta),
  Round(m_srcPoly[j].Y + m_normals[j].Y * m_delta)));
}